

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# temporary_memory_manager.cpp
# Opt level: O2

void __thiscall
duckdb::TemporaryMemoryManager::UpdateConfiguration
          (TemporaryMemoryManager *this,ClientContext *context)

{
  int iVar1;
  int32_t val;
  BufferManager *this_00;
  TaskScheduler *this_01;
  undefined4 extraout_var;
  ulong uVar2;
  unsigned_long uVar3;
  ConnectionManager *this_02;
  idx_t iVar4;
  undefined1 auVar5 [16];
  double dVar6;
  
  this_00 = BufferManager::GetBufferManager(context);
  this_01 = TaskScheduler::GetScheduler(context);
  iVar1 = (*this_00->_vptr_BufferManager[0xb])(this_00);
  auVar5._4_4_ = extraout_var;
  auVar5._0_4_ = iVar1;
  auVar5._8_4_ = extraout_var;
  auVar5._12_4_ = 0x45300000;
  dVar6 = ((auVar5._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,iVar1) - 4503599627370496.0)) * 0.9;
  uVar2 = (ulong)dVar6;
  this->memory_limit = (long)(dVar6 - 9.223372036854776e+18) & (long)uVar2 >> 0x3f | uVar2;
  iVar1 = (*this_00->_vptr_BufferManager[0x1d])(this_00);
  this->has_temporary_directory = SUB41(iVar1,0);
  val = TaskScheduler::NumberOfThreads(this_01);
  uVar3 = NumericCastImpl<unsigned_long,_int,_false>::Convert(val);
  this->num_threads = uVar3;
  this_02 = ConnectionManager::Get(context);
  iVar4 = ConnectionManager::GetConnectionCount(this_02);
  this->num_connections = iVar4;
  iVar4 = BufferManager::GetQueryMaxMemory(this_00);
  this->query_max_memory = iVar4;
  return;
}

Assistant:

void TemporaryMemoryManager::UpdateConfiguration(ClientContext &context) {
	auto &buffer_manager = BufferManager::GetBufferManager(context);
	auto &task_scheduler = TaskScheduler::GetScheduler(context);

	memory_limit =
	    LossyNumericCast<idx_t>(MAXIMUM_MEMORY_LIMIT_RATIO * static_cast<double>(buffer_manager.GetMaxMemory()));
	has_temporary_directory = buffer_manager.HasTemporaryDirectory();
	num_threads = NumericCast<idx_t>(task_scheduler.NumberOfThreads());
	num_connections = ConnectionManager::Get(context).GetConnectionCount();
	query_max_memory = buffer_manager.GetQueryMaxMemory();
}